

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O0

void __thiscall
embree::XMLWriter::store_array_binary(XMLWriter *this,char *name,avector<Vec3fa> *vec)

{
  ostream *poVar1;
  streamoff sVar2;
  long in_RDX;
  char *in_RSI;
  XMLWriter *in_RDI;
  size_t i;
  streampos offset;
  ulong local_50;
  fpos local_48 [16];
  long local_38;
  char *local_30;
  long local_20;
  long local_18;
  ulong local_10;
  long local_8;
  
  local_38 = in_RDX;
  local_30 = in_RSI;
  local_48 = (fpos  [16])std::istream::tellg();
  tab(in_RDI);
  poVar1 = std::operator<<((ostream *)&in_RDI->field_0x10,"<");
  poVar1 = std::operator<<(poVar1,local_30);
  poVar1 = std::operator<<(poVar1," ofs=\"");
  sVar2 = std::fpos::operator_cast_to_long(local_48);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar2);
  poVar1 = std::operator<<(poVar1,"\" size=\"");
  local_18 = local_38;
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(ulong *)(local_38 + 8));
  poVar1 = std::operator<<(poVar1,"\"/>");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (local_50 = 0; local_20 = local_38, local_50 < *(ulong *)(local_38 + 8);
      local_50 = local_50 + 1) {
    local_8 = local_38;
    local_10 = local_50;
    std::ostream::write(&in_RDI->field_0x220,*(long *)(local_38 + 0x18) + local_50 * 0x10);
  }
  return;
}

Assistant:

void XMLWriter::store_array_binary(const char* name, const avector<Vec3fa>& vec)
  {
    std::streampos offset = bin.tellg();
    tab(); xml << "<" << name << " ofs=\"" << offset << "\" size=\"" << vec.size() << "\"/>" << std::endl;
    for (size_t i=0; i<vec.size(); i++) bin.write((char*)&vec[i],sizeof(Vec3f));
  }